

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall
format::mtx_arith_error::mtx_arith_error
          (mtx_arith_error *this,string *expected_arith,string *got_arith,string *filename,
          string *msg)

{
  string local_70;
  string local_50;
  string *local_30;
  string *msg_local;
  string *filename_local;
  string *got_arith_local;
  string *expected_arith_local;
  mtx_arith_error *this_local;
  
  local_30 = msg;
  msg_local = filename;
  filename_local = got_arith;
  got_arith_local = expected_arith;
  expected_arith_local = (string *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)filename);
  std::__cxx11::string::string((string *)&local_70,(string *)msg);
  mtx_error::mtx_error(&this->super_mtx_error,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)&this->super_mtx_error = &PTR__mtx_arith_error_00217690;
  std::__cxx11::string::string((string *)&this->expected_arith_);
  std::__cxx11::string::string((string *)&this->got_arith_);
  std::__cxx11::string::operator=((string *)&this->expected_arith_,(string *)expected_arith);
  std::__cxx11::string::operator=((string *)&this->got_arith_,(string *)got_arith);
  return;
}

Assistant:

mtx_arith_error
  (
    std::string expected_arith,
    std::string got_arith,
    std::string filename="Unknown",
    std::string msg="Matrix arithmetic mismatch"
  )
  : mtx_error(filename, msg)
  {
   expected_arith_ = expected_arith;
   got_arith_ = got_arith;
  }